

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O2

bool __thiscall
cmStandardLevelResolver::CompileFeatureKnown
          (cmStandardLevelResolver *this,string *targetName,string *feature,string *lang,
          string *error)

{
  cmMakefile *this_00;
  size_type sVar1;
  char **ppcVar2;
  pointer_____offset_0x10___ *ppuVar3;
  ostream *poVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  size_type local_268;
  char local_260 [8];
  undefined8 uStack_258;
  cmStandardLevelResolver *local_250;
  string local_248;
  cmStrCmp local_228;
  cmStrCmp local_208;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  ostringstream e;
  
  local_250 = this;
  sVar1 = cmGeneratorExpression::Find(feature);
  if (sVar1 != 0xffffffffffffffff) {
    __assert_fail("cmGeneratorExpression::Find(feature) == std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmStandardLevelResolver.cxx"
                  ,0x1f0,
                  "bool cmStandardLevelResolver::CompileFeatureKnown(const std::string &, const std::string &, std::string &, std::string *) const"
                 );
  }
  std::__cxx11::string::string((string *)&local_270,(string *)feature);
  local_1c8.Test_._M_dataplus._M_p = (pointer)&local_1c8.Test_.field_2;
  if (local_270 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260) {
    local_1c8.Test_.field_2._8_8_ = uStack_258;
  }
  else {
    local_1c8.Test_._M_dataplus._M_p = (pointer)local_270;
  }
  local_1c8.Test_._M_string_length = local_268;
  local_268 = 0;
  local_260[0] = '\0';
  local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260;
  ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                      ((char **)((anonymous_namespace)::C_FEATURES + 8),
                       (char **)(anonymous_namespace)::CXX_FEATURES,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_270);
  if (ppcVar2 == (char **)(anonymous_namespace)::CXX_FEATURES) {
    std::__cxx11::string::string((string *)&local_290,(string *)feature);
    local_1e8.Test_._M_dataplus._M_p = (pointer)&local_1e8.Test_.field_2;
    if (local_290 == &local_280) {
      local_1e8.Test_.field_2._8_8_ = local_280._8_8_;
    }
    else {
      local_1e8.Test_._M_dataplus._M_p = (pointer)local_290;
    }
    local_1e8.Test_._M_string_length = local_288;
    local_288 = 0;
    local_280._M_local_buf[0] = '\0';
    local_290 = &local_280;
    ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                        ((char **)((anonymous_namespace)::CXX_FEATURES + 8),(char **)&DAT_007d0cd8,
                         &local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_290);
    if (ppcVar2 == (char **)&DAT_007d0cd8) {
      std::__cxx11::string::string((string *)&local_2b0,(string *)feature);
      local_208.Test_._M_dataplus._M_p = (pointer)&local_208.Test_.field_2;
      if (local_2b0 == &local_2a0) {
        local_208.Test_.field_2._8_8_ = local_2a0._8_8_;
      }
      else {
        local_208.Test_._M_dataplus._M_p = (pointer)local_2b0;
      }
      local_208.Test_._M_string_length = local_2a8;
      local_2a8 = 0;
      local_2a0._M_local_buf[0] = '\0';
      local_2b0 = &local_2a0;
      ppcVar2 = std::find_if<char_const*const*,cmStrCmp>
                          ((char **)((anonymous_namespace)::CUDA_FEATURES + 8),
                           (char **)(anonymous_namespace)::HIP_FEATURES,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_2b0);
      if (ppcVar2 == (char **)(anonymous_namespace)::HIP_FEATURES) {
        std::__cxx11::string::string((string *)&local_2d0,(string *)feature);
        local_228.Test_._M_dataplus._M_p = (pointer)&local_228.Test_.field_2;
        if (local_2d0 == &local_2c0) {
          local_228.Test_.field_2._8_8_ = local_2c0._8_8_;
        }
        else {
          local_228.Test_._M_dataplus._M_p = (pointer)local_2d0;
        }
        local_228.Test_._M_string_length = local_2c8;
        local_2c8 = 0;
        local_2c0._M_local_buf[0] = '\0';
        local_2d0 = &local_2c0;
        ppuVar3 = std::find_if<char_const*const*,cmStrCmp>
                            ((char **)((anonymous_namespace)::HIP_FEATURES + 8),
                             &cmLegacyCommandWrapper::typeinfo,&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_2d0);
        if (ppuVar3 == &cmLegacyCommandWrapper::typeinfo) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pcVar5 = "specified";
          if (error == (string *)0x0) {
            pcVar5 = "Specified";
          }
          std::operator<<((ostream *)&e,pcVar5);
          poVar4 = std::operator<<((ostream *)&e," unknown feature \"");
          poVar4 = std::operator<<(poVar4,(string *)feature);
          poVar4 = std::operator<<(poVar4,"\" for target \"");
          poVar4 = std::operator<<(poVar4,(string *)targetName);
          std::operator<<(poVar4,"\".");
          if (error == (string *)0x0) {
            this_00 = local_250->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_248);
          }
          else {
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)error,(string *)&local_248);
          }
          std::__cxx11::string::~string((string *)&local_248);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          return false;
        }
      }
    }
  }
  std::__cxx11::string::assign((char *)lang);
  return true;
}

Assistant:

bool cmStandardLevelResolver::CompileFeatureKnown(
  const std::string& targetName, const std::string& feature, std::string& lang,
  std::string* error) const
{
  assert(cmGeneratorExpression::Find(feature) == std::string::npos);

  bool isCFeature =
    std::find_if(cm::cbegin(C_FEATURES) + 1, cm::cend(C_FEATURES),
                 cmStrCmp(feature)) != cm::cend(C_FEATURES);
  if (isCFeature) {
    lang = "C";
    return true;
  }
  bool isCxxFeature =
    std::find_if(cm::cbegin(CXX_FEATURES) + 1, cm::cend(CXX_FEATURES),
                 cmStrCmp(feature)) != cm::cend(CXX_FEATURES);
  if (isCxxFeature) {
    lang = "CXX";
    return true;
  }
  bool isCudaFeature =
    std::find_if(cm::cbegin(CUDA_FEATURES) + 1, cm::cend(CUDA_FEATURES),
                 cmStrCmp(feature)) != cm::cend(CUDA_FEATURES);
  if (isCudaFeature) {
    lang = "CUDA";
    return true;
  }
  bool isHIPFeature =
    std::find_if(cm::cbegin(HIP_FEATURES) + 1, cm::cend(HIP_FEATURES),
                 cmStrCmp(feature)) != cm::cend(HIP_FEATURES);
  if (isHIPFeature) {
    lang = "HIP";
    return true;
  }
  std::ostringstream e;
  if (error) {
    e << "specified";
  } else {
    e << "Specified";
  }
  e << " unknown feature \"" << feature
    << "\" for "
       "target \""
    << targetName << "\".";
  if (error) {
    *error = e.str();
  } else {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }
  return false;
}